

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int xferOptimization(Parse *pParse,Table *pDest,Select *pSelect,int onError,int iDbDest)

{
  int iCur;
  sqlite3 *db_00;
  Column *pCVar1;
  Column *pCVar2;
  bool bVar3;
  int iVar4;
  int iDb;
  int iVar5;
  int p2;
  int p2_00;
  int iVar6;
  Trigger *pTVar7;
  Table *pTab;
  Vdbe *p;
  char *zColl;
  u8 idxInsFlags;
  u8 insFlags;
  Column *pSrcCol;
  Column *pDestCol;
  int regRowid;
  int regData;
  int destHasUniqueIdx;
  int regAutoinc;
  Vdbe *v;
  int emptySrcTest;
  int emptyDestTest;
  int addr2;
  int addr1;
  int iDest;
  int iSrc;
  int iDbSrc;
  int i;
  SrcList_item *pItem;
  Index *pDestIdx;
  Index *pSrcIdx;
  Table *pSrc;
  ExprList *pEList;
  sqlite3 *db;
  int iDbDest_local;
  int onError_local;
  Select *pSelect_local;
  Table *pDest_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  v._4_4_ = 0;
  v._0_4_ = 0;
  bVar3 = false;
  if (pSelect == (Select *)0x0) {
    pParse_local._4_4_ = 0;
  }
  else if ((pParse->pWith == (With *)0x0) && (pSelect->pWith == (With *)0x0)) {
    pTVar7 = sqlite3TriggerList(pParse,pDest);
    if (pTVar7 == (Trigger *)0x0) {
      if (pDest->nModuleArg == 0) {
        db._4_4_ = onError;
        if (onError == 0xb) {
          if (-1 < pDest->iPKey) {
            db._4_4_ = (uint)pDest->keyConf;
          }
          if (db._4_4_ == 0xb) {
            db._4_4_ = 2;
          }
        }
        if (pSelect->pSrc->nSrc == 1) {
          if (pSelect->pSrc->a[0].pSelect == (Select *)0x0) {
            if (pSelect->pWhere == (Expr *)0x0) {
              if (pSelect->pOrderBy == (ExprList *)0x0) {
                if (pSelect->pGroupBy == (ExprList *)0x0) {
                  if (pSelect->pLimit == (Expr *)0x0) {
                    if (pSelect->pPrior == (Select *)0x0) {
                      if ((pSelect->selFlags & 1) == 0) {
                        if (pSelect->pEList->nExpr == 1) {
                          if ((pSelect->pEList->a[0].pExpr)->op == 0xa8) {
                            pTab = sqlite3LocateTableItem(pParse,0,pSelect->pSrc->a);
                            if (pTab == (Table *)0x0) {
                              pParse_local._4_4_ = 0;
                            }
                            else if (pTab == pDest) {
                              pParse_local._4_4_ = 0;
                            }
                            else if (((pDest->tabFlags & 0x20) == 0) ==
                                     ((pTab->tabFlags & 0x20) == 0)) {
                              if (pTab->nModuleArg == 0) {
                                if (pTab->pSelect == (Select *)0x0) {
                                  if (pDest->nCol == pTab->nCol) {
                                    if (pDest->iPKey == pTab->iPKey) {
                                      for (iSrc = 0; iSrc < pDest->nCol; iSrc = iSrc + 1) {
                                        pCVar1 = pDest->aCol;
                                        pCVar2 = pTab->aCol;
                                        if (pCVar1[iSrc].affinity != pCVar2[iSrc].affinity) {
                                          return 0;
                                        }
                                        iVar4 = sqlite3_stricmp(pCVar1[iSrc].zColl,
                                                                pCVar2[iSrc].zColl);
                                        if (iVar4 != 0) {
                                          return 0;
                                        }
                                        if ((pCVar1[iSrc].notNull != '\0') &&
                                           (pCVar2[iSrc].notNull == '\0')) {
                                          return 0;
                                        }
                                        if ((0 < iSrc) &&
                                           (((pCVar1[iSrc].pDflt == (Expr *)0x0) !=
                                             (pCVar2[iSrc].pDflt == (Expr *)0x0) ||
                                            ((pCVar1[iSrc].pDflt != (Expr *)0x0 &&
                                             (iVar4 = strcmp(((pCVar1[iSrc].pDflt)->u).zToken,
                                                             ((pCVar2[iSrc].pDflt)->u).zToken),
                                             iVar4 != 0)))))) {
                                          return 0;
                                        }
                                      }
                                      for (pItem = (SrcList_item *)pDest->pIndex;
                                          pItem != (SrcList_item *)0x0;
                                          pItem = (SrcList_item *)pItem->pSelect) {
                                        if (*(char *)((long)&pItem->u1 + 2) != '\0') {
                                          bVar3 = true;
                                        }
                                        pDestIdx = pTab->pIndex;
                                        while ((pDestIdx != (Index *)0x0 &&
                                               (iVar4 = xferCompatibleIndex((Index *)pItem,pDestIdx)
                                               , iVar4 == 0))) {
                                          pDestIdx = pDestIdx->pNext;
                                        }
                                        if (pDestIdx == (Index *)0x0) {
                                          return 0;
                                        }
                                      }
                                      if ((pDest->pCheck == (ExprList *)0x0) ||
                                         (iVar4 = sqlite3ExprListCompare
                                                            (pTab->pCheck,pDest->pCheck,-1),
                                         iVar4 == 0)) {
                                        if (((db_00->flags & 0x4000) == 0) ||
                                           (pDest->pFKey == (FKey *)0x0)) {
                                          if ((db_00->flags & 0x80) == 0) {
                                            iDb = sqlite3SchemaToIndex(db_00,pTab->pSchema);
                                            p = sqlite3GetVdbe(pParse);
                                            sqlite3CodeVerifySchema(pParse,iDb);
                                            iVar4 = pParse->nTab;
                                            pParse->nTab = iVar4 + 1;
                                            iCur = pParse->nTab;
                                            pParse->nTab = iCur + 1;
                                            iVar5 = autoIncBegin(pParse,iDbDest,pDest);
                                            p2 = sqlite3GetTempReg(pParse);
                                            p2_00 = sqlite3GetTempReg(pParse);
                                            sqlite3OpenTable(pParse,iCur,iDbDest,pDest,0x6e);
                                            if (((db_00->mDbFlags & 4) == 0) &&
                                               ((((pDest->iPKey < 0 &&
                                                  (pDest->pIndex != (Index *)0x0)) || (bVar3)) ||
                                                ((db._4_4_ != 2 && (db._4_4_ != 1)))))) {
                                              iVar6 = sqlite3VdbeAddOp2(p,0x24,iCur,0);
                                              v._4_4_ = sqlite3VdbeAddOp0(p,0xb);
                                              sqlite3VdbeJumpHere(p,iVar6);
                                            }
                                            if ((pTab->tabFlags & 0x20) == 0) {
                                              sqlite3OpenTable(pParse,iVar4,iDb,pTab,0x6d);
                                              v._0_4_ = sqlite3VdbeAddOp2(p,0x24,iVar4,0);
                                              if (pDest->iPKey < 0) {
                                                if (pDest->pIndex == (Index *)0x0) {
                                                  emptyDestTest =
                                                       sqlite3VdbeAddOp2(p,0x79,iCur,p2_00);
                                                }
                                                else {
                                                  emptyDestTest =
                                                       sqlite3VdbeAddOp2(p,0x81,iVar4,p2_00);
                                                }
                                              }
                                              else {
                                                emptyDestTest =
                                                     sqlite3VdbeAddOp2(p,0x81,iVar4,p2_00);
                                                iVar6 = sqlite3VdbeAddOp3(p,0x1f,iCur,0,p2_00);
                                                sqlite3RowidConstraint(pParse,db._4_4_,pDest);
                                                sqlite3VdbeJumpHere(p,iVar6);
                                                autoIncStep(pParse,iVar5,p2_00);
                                              }
                                              sqlite3VdbeAddOp3(p,0x80,iVar4,p2,1);
                                              if ((db_00->mDbFlags & 4) == 0) {
                                                zColl._7_1_ = 0x29;
                                              }
                                              else {
                                                sqlite3VdbeAddOp1(p,0x83,iCur);
                                                zColl._7_1_ = 0x39;
                                              }
                                              sqlite3VdbeAddOp4(p,0x7a,iCur,p2,p2_00,(char *)pDest,
                                                                -6);
                                              sqlite3VdbeChangeP5(p,(ushort)zColl._7_1_);
                                              sqlite3VdbeAddOp2(p,5,iVar4,emptyDestTest);
                                              sqlite3VdbeAddOp2(p,0x75,iVar4,0);
                                              sqlite3VdbeAddOp2(p,0x75,iCur,0);
                                            }
                                            else {
                                              sqlite3TableLock(pParse,iDbDest,pDest->tnum,'\x01',
                                                               pDest->zName);
                                              sqlite3TableLock(pParse,iDb,pTab->tnum,'\0',
                                                               pTab->zName);
                                            }
                                            for (pItem = (SrcList_item *)pDest->pIndex;
                                                pItem != (SrcList_item *)0x0;
                                                pItem = (SrcList_item *)pItem->pSelect) {
                                              zColl._6_1_ = 0;
                                              pDestIdx = pTab->pIndex;
                                              while ((pDestIdx != (Index *)0x0 &&
                                                     (iVar5 = xferCompatibleIndex((Index *)pItem,
                                                                                  pDestIdx),
                                                     iVar5 == 0))) {
                                                pDestIdx = pDestIdx->pNext;
                                              }
                                              sqlite3VdbeAddOp3(p,0x6d,iVar4,pDestIdx->tnum,iDb);
                                              sqlite3VdbeSetP4KeyInfo(pParse,pDestIdx);
                                              sqlite3VdbeAddOp3(p,0x6e,iCur,(int)pItem->colUsed,
                                                                iDbDest);
                                              sqlite3VdbeSetP4KeyInfo(pParse,(Index *)pItem);
                                              sqlite3VdbeChangeP5(p,1);
                                              iVar5 = sqlite3VdbeAddOp2(p,0x24,iVar4,0);
                                              sqlite3VdbeAddOp3(p,0x80,iVar4,p2,1);
                                              if ((db_00->mDbFlags & 4) != 0) {
                                                iSrc = 0;
                                                while ((iSrc < (int)(uint)pDestIdx->nColumn &&
                                                       (iVar6 = sqlite3_stricmp("BINARY",pDestIdx->
                                                                                         azColl[iSrc
                                                  ]), iVar6 == 0))) {
                                                  iSrc = iSrc + 1;
                                                }
                                                if (iSrc == (uint)pDestIdx->nColumn) {
                                                  zColl._6_1_ = 0x10;
                                                  sqlite3VdbeAddOp1(p,0x83,iCur);
                                                }
                                              }
                                              if (((pTab->tabFlags & 0x20) != 0) &&
                                                 (((ulong)(pItem->u1).zIndexedBy & 0x3000000) ==
                                                  0x2000000)) {
                                                zColl._6_1_ = zColl._6_1_ | 1;
                                              }
                                              sqlite3VdbeAddOp2(p,0x85,iCur,p2);
                                              sqlite3VdbeChangeP5(p,zColl._6_1_ | 8);
                                              sqlite3VdbeAddOp2(p,5,iVar4,iVar5 + 1);
                                              sqlite3VdbeJumpHere(p,iVar5);
                                              sqlite3VdbeAddOp2(p,0x75,iVar4,0);
                                              sqlite3VdbeAddOp2(p,0x75,iCur,0);
                                            }
                                            if ((int)v != 0) {
                                              sqlite3VdbeJumpHere(p,(int)v);
                                            }
                                            sqlite3ReleaseTempReg(pParse,p2_00);
                                            sqlite3ReleaseTempReg(pParse,p2);
                                            if (v._4_4_ == 0) {
                                              pParse_local._4_4_ = 1;
                                            }
                                            else {
                                              sqlite3AutoincrementEnd(pParse);
                                              sqlite3VdbeAddOp2(p,0x45,0,0);
                                              sqlite3VdbeJumpHere(p,v._4_4_);
                                              sqlite3VdbeAddOp2(p,0x75,iCur,0);
                                              pParse_local._4_4_ = 0;
                                            }
                                          }
                                          else {
                                            pParse_local._4_4_ = 0;
                                          }
                                        }
                                        else {
                                          pParse_local._4_4_ = 0;
                                        }
                                      }
                                      else {
                                        pParse_local._4_4_ = 0;
                                      }
                                    }
                                    else {
                                      pParse_local._4_4_ = 0;
                                    }
                                  }
                                  else {
                                    pParse_local._4_4_ = 0;
                                  }
                                }
                                else {
                                  pParse_local._4_4_ = 0;
                                }
                              }
                              else {
                                pParse_local._4_4_ = 0;
                              }
                            }
                            else {
                              pParse_local._4_4_ = 0;
                            }
                          }
                          else {
                            pParse_local._4_4_ = 0;
                          }
                        }
                        else {
                          pParse_local._4_4_ = 0;
                        }
                      }
                      else {
                        pParse_local._4_4_ = 0;
                      }
                    }
                    else {
                      pParse_local._4_4_ = 0;
                    }
                  }
                  else {
                    pParse_local._4_4_ = 0;
                  }
                }
                else {
                  pParse_local._4_4_ = 0;
                }
              }
              else {
                pParse_local._4_4_ = 0;
              }
            }
            else {
              pParse_local._4_4_ = 0;
            }
          }
          else {
            pParse_local._4_4_ = 0;
          }
        }
        else {
          pParse_local._4_4_ = 0;
        }
      }
      else {
        pParse_local._4_4_ = 0;
      }
    }
    else {
      pParse_local._4_4_ = 0;
    }
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

static int xferOptimization(
  Parse *pParse,        /* Parser context */
  Table *pDest,         /* The table we are inserting into */
  Select *pSelect,      /* A SELECT statement to use as the data source */
  int onError,          /* How to handle constraint errors */
  int iDbDest           /* The database of pDest */
){
  sqlite3 *db = pParse->db;
  ExprList *pEList;                /* The result set of the SELECT */
  Table *pSrc;                     /* The table in the FROM clause of SELECT */
  Index *pSrcIdx, *pDestIdx;       /* Source and destination indices */
  struct SrcList_item *pItem;      /* An element of pSelect->pSrc */
  int i;                           /* Loop counter */
  int iDbSrc;                      /* The database of pSrc */
  int iSrc, iDest;                 /* Cursors from source and destination */
  int addr1, addr2;                /* Loop addresses */
  int emptyDestTest = 0;           /* Address of test for empty pDest */
  int emptySrcTest = 0;            /* Address of test for empty pSrc */
  Vdbe *v;                         /* The VDBE we are building */
  int regAutoinc;                  /* Memory register used by AUTOINC */
  int destHasUniqueIdx = 0;        /* True if pDest has a UNIQUE index */
  int regData, regRowid;           /* Registers holding data and rowid */

  if( pSelect==0 ){
    return 0;   /* Must be of the form  INSERT INTO ... SELECT ... */
  }
  if( pParse->pWith || pSelect->pWith ){
    /* Do not attempt to process this query if there are an WITH clauses
    ** attached to it. Proceeding may generate a false "no such table: xxx"
    ** error if pSelect reads from a CTE named "xxx".  */
    return 0;
  }
  if( sqlite3TriggerList(pParse, pDest) ){
    return 0;   /* tab1 must not have triggers */
  }
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pDest) ){
    return 0;   /* tab1 must not be a virtual table */
  }
#endif
  if( onError==OE_Default ){
    if( pDest->iPKey>=0 ) onError = pDest->keyConf;
    if( onError==OE_Default ) onError = OE_Abort;
  }
  assert(pSelect->pSrc);   /* allocated even if there is no FROM clause */
  if( pSelect->pSrc->nSrc!=1 ){
    return 0;   /* FROM clause must have exactly one term */
  }
  if( pSelect->pSrc->a[0].pSelect ){
    return 0;   /* FROM clause cannot contain a subquery */
  }
  if( pSelect->pWhere ){
    return 0;   /* SELECT may not have a WHERE clause */
  }
  if( pSelect->pOrderBy ){
    return 0;   /* SELECT may not have an ORDER BY clause */
  }
  /* Do not need to test for a HAVING clause.  If HAVING is present but
  ** there is no ORDER BY, we will get an error. */
  if( pSelect->pGroupBy ){
    return 0;   /* SELECT may not have a GROUP BY clause */
  }
  if( pSelect->pLimit ){
    return 0;   /* SELECT may not have a LIMIT clause */
  }
  if( pSelect->pPrior ){
    return 0;   /* SELECT may not be a compound query */
  }
  if( pSelect->selFlags & SF_Distinct ){
    return 0;   /* SELECT may not be DISTINCT */
  }
  pEList = pSelect->pEList;
  assert( pEList!=0 );
  if( pEList->nExpr!=1 ){
    return 0;   /* The result set must have exactly one column */
  }
  assert( pEList->a[0].pExpr );
  if( pEList->a[0].pExpr->op!=TK_ASTERISK ){
    return 0;   /* The result set must be the special operator "*" */
  }

  /* At this point we have established that the statement is of the
  ** correct syntactic form to participate in this optimization.  Now
  ** we have to check the semantics.
  */
  pItem = pSelect->pSrc->a;
  pSrc = sqlite3LocateTableItem(pParse, 0, pItem);
  if( pSrc==0 ){
    return 0;   /* FROM clause does not contain a real table */
  }
  if( pSrc==pDest ){
    return 0;   /* tab1 and tab2 may not be the same table */
  }
  if( HasRowid(pDest)!=HasRowid(pSrc) ){
    return 0;   /* source and destination must both be WITHOUT ROWID or not */
  }
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pSrc) ){
    return 0;   /* tab2 must not be a virtual table */
  }
#endif
  if( pSrc->pSelect ){
    return 0;   /* tab2 may not be a view */
  }
  if( pDest->nCol!=pSrc->nCol ){
    return 0;   /* Number of columns must be the same in tab1 and tab2 */
  }
  if( pDest->iPKey!=pSrc->iPKey ){
    return 0;   /* Both tables must have the same INTEGER PRIMARY KEY */
  }
  for(i=0; i<pDest->nCol; i++){
    Column *pDestCol = &pDest->aCol[i];
    Column *pSrcCol = &pSrc->aCol[i];
#ifdef SQLITE_ENABLE_HIDDEN_COLUMNS
    if( (db->mDbFlags & DBFLAG_Vacuum)==0 
     && (pDestCol->colFlags | pSrcCol->colFlags) & COLFLAG_HIDDEN 
    ){
      return 0;    /* Neither table may have __hidden__ columns */
    }
#endif
    if( pDestCol->affinity!=pSrcCol->affinity ){
      return 0;    /* Affinity must be the same on all columns */
    }
    if( sqlite3_stricmp(pDestCol->zColl, pSrcCol->zColl)!=0 ){
      return 0;    /* Collating sequence must be the same on all columns */
    }
    if( pDestCol->notNull && !pSrcCol->notNull ){
      return 0;    /* tab2 must be NOT NULL if tab1 is */
    }
    /* Default values for second and subsequent columns need to match. */
    if( i>0 ){
      assert( pDestCol->pDflt==0 || pDestCol->pDflt->op==TK_SPAN );
      assert( pSrcCol->pDflt==0 || pSrcCol->pDflt->op==TK_SPAN );
      if( (pDestCol->pDflt==0)!=(pSrcCol->pDflt==0) 
       || (pDestCol->pDflt && strcmp(pDestCol->pDflt->u.zToken,
                                       pSrcCol->pDflt->u.zToken)!=0)
      ){
        return 0;    /* Default values must be the same for all columns */
      }
    }
  }
  for(pDestIdx=pDest->pIndex; pDestIdx; pDestIdx=pDestIdx->pNext){
    if( IsUniqueIndex(pDestIdx) ){
      destHasUniqueIdx = 1;
    }
    for(pSrcIdx=pSrc->pIndex; pSrcIdx; pSrcIdx=pSrcIdx->pNext){
      if( xferCompatibleIndex(pDestIdx, pSrcIdx) ) break;
    }
    if( pSrcIdx==0 ){
      return 0;    /* pDestIdx has no corresponding index in pSrc */
    }
  }
#ifndef SQLITE_OMIT_CHECK
  if( pDest->pCheck && sqlite3ExprListCompare(pSrc->pCheck,pDest->pCheck,-1) ){
    return 0;   /* Tables have different CHECK constraints.  Ticket #2252 */
  }
#endif
#ifndef SQLITE_OMIT_FOREIGN_KEY
  /* Disallow the transfer optimization if the destination table constains
  ** any foreign key constraints.  This is more restrictive than necessary.
  ** But the main beneficiary of the transfer optimization is the VACUUM 
  ** command, and the VACUUM command disables foreign key constraints.  So
  ** the extra complication to make this rule less restrictive is probably
  ** not worth the effort.  Ticket [6284df89debdfa61db8073e062908af0c9b6118e]
  */
  if( (db->flags & SQLITE_ForeignKeys)!=0 && pDest->pFKey!=0 ){
    return 0;
  }
#endif
  if( (db->flags & SQLITE_CountRows)!=0 ){
    return 0;  /* xfer opt does not play well with PRAGMA count_changes */
  }

  /* If we get this far, it means that the xfer optimization is at
  ** least a possibility, though it might only work if the destination
  ** table (tab1) is initially empty.
  */
#ifdef SQLITE_TEST
  sqlite3_xferopt_count++;
#endif
  iDbSrc = sqlite3SchemaToIndex(db, pSrc->pSchema);
  v = sqlite3GetVdbe(pParse);
  sqlite3CodeVerifySchema(pParse, iDbSrc);
  iSrc = pParse->nTab++;
  iDest = pParse->nTab++;
  regAutoinc = autoIncBegin(pParse, iDbDest, pDest);
  regData = sqlite3GetTempReg(pParse);
  regRowid = sqlite3GetTempReg(pParse);
  sqlite3OpenTable(pParse, iDest, iDbDest, pDest, OP_OpenWrite);
  assert( HasRowid(pDest) || destHasUniqueIdx );
  if( (db->mDbFlags & DBFLAG_Vacuum)==0 && (
      (pDest->iPKey<0 && pDest->pIndex!=0)          /* (1) */
   || destHasUniqueIdx                              /* (2) */
   || (onError!=OE_Abort && onError!=OE_Rollback)   /* (3) */
  )){
    /* In some circumstances, we are able to run the xfer optimization
    ** only if the destination table is initially empty. Unless the
    ** DBFLAG_Vacuum flag is set, this block generates code to make
    ** that determination. If DBFLAG_Vacuum is set, then the destination
    ** table is always empty.
    **
    ** Conditions under which the destination must be empty:
    **
    ** (1) There is no INTEGER PRIMARY KEY but there are indices.
    **     (If the destination is not initially empty, the rowid fields
    **     of index entries might need to change.)
    **
    ** (2) The destination has a unique index.  (The xfer optimization 
    **     is unable to test uniqueness.)
    **
    ** (3) onError is something other than OE_Abort and OE_Rollback.
    */
    addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iDest, 0); VdbeCoverage(v);
    emptyDestTest = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, addr1);
  }
  if( HasRowid(pSrc) ){
    u8 insFlags;
    sqlite3OpenTable(pParse, iSrc, iDbSrc, pSrc, OP_OpenRead);
    emptySrcTest = sqlite3VdbeAddOp2(v, OP_Rewind, iSrc, 0); VdbeCoverage(v);
    if( pDest->iPKey>=0 ){
      addr1 = sqlite3VdbeAddOp2(v, OP_Rowid, iSrc, regRowid);
      sqlite3VdbeVerifyAbortable(v, onError);
      addr2 = sqlite3VdbeAddOp3(v, OP_NotExists, iDest, 0, regRowid);
      VdbeCoverage(v);
      sqlite3RowidConstraint(pParse, onError, pDest);
      sqlite3VdbeJumpHere(v, addr2);
      autoIncStep(pParse, regAutoinc, regRowid);
    }else if( pDest->pIndex==0 ){
      addr1 = sqlite3VdbeAddOp2(v, OP_NewRowid, iDest, regRowid);
    }else{
      addr1 = sqlite3VdbeAddOp2(v, OP_Rowid, iSrc, regRowid);
      assert( (pDest->tabFlags & TF_Autoincrement)==0 );
    }
    sqlite3VdbeAddOp3(v, OP_RowData, iSrc, regData, 1);
    if( db->mDbFlags & DBFLAG_Vacuum ){
      sqlite3VdbeAddOp1(v, OP_SeekEnd, iDest);
      insFlags = OPFLAG_NCHANGE|OPFLAG_LASTROWID|
                           OPFLAG_APPEND|OPFLAG_USESEEKRESULT;
    }else{
      insFlags = OPFLAG_NCHANGE|OPFLAG_LASTROWID|OPFLAG_APPEND;
    }
    sqlite3VdbeAddOp4(v, OP_Insert, iDest, regData, regRowid,
                      (char*)pDest, P4_TABLE);
    sqlite3VdbeChangeP5(v, insFlags);
    sqlite3VdbeAddOp2(v, OP_Next, iSrc, addr1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Close, iSrc, 0);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
  }else{
    sqlite3TableLock(pParse, iDbDest, pDest->tnum, 1, pDest->zName);
    sqlite3TableLock(pParse, iDbSrc, pSrc->tnum, 0, pSrc->zName);
  }
  for(pDestIdx=pDest->pIndex; pDestIdx; pDestIdx=pDestIdx->pNext){
    u8 idxInsFlags = 0;
    for(pSrcIdx=pSrc->pIndex; ALWAYS(pSrcIdx); pSrcIdx=pSrcIdx->pNext){
      if( xferCompatibleIndex(pDestIdx, pSrcIdx) ) break;
    }
    assert( pSrcIdx );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iSrc, pSrcIdx->tnum, iDbSrc);
    sqlite3VdbeSetP4KeyInfo(pParse, pSrcIdx);
    VdbeComment((v, "%s", pSrcIdx->zName));
    sqlite3VdbeAddOp3(v, OP_OpenWrite, iDest, pDestIdx->tnum, iDbDest);
    sqlite3VdbeSetP4KeyInfo(pParse, pDestIdx);
    sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR);
    VdbeComment((v, "%s", pDestIdx->zName));
    addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iSrc, 0); VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_RowData, iSrc, regData, 1);
    if( db->mDbFlags & DBFLAG_Vacuum ){
      /* This INSERT command is part of a VACUUM operation, which guarantees
      ** that the destination table is empty. If all indexed columns use
      ** collation sequence BINARY, then it can also be assumed that the
      ** index will be populated by inserting keys in strictly sorted 
      ** order. In this case, instead of seeking within the b-tree as part
      ** of every OP_IdxInsert opcode, an OP_SeekEnd is added before the
      ** OP_IdxInsert to seek to the point within the b-tree where each key 
      ** should be inserted. This is faster.
      **
      ** If any of the indexed columns use a collation sequence other than
      ** BINARY, this optimization is disabled. This is because the user 
      ** might change the definition of a collation sequence and then run
      ** a VACUUM command. In that case keys may not be written in strictly
      ** sorted order.  */
      for(i=0; i<pSrcIdx->nColumn; i++){
        const char *zColl = pSrcIdx->azColl[i];
        if( sqlite3_stricmp(sqlite3StrBINARY, zColl) ) break;
      }
      if( i==pSrcIdx->nColumn ){
        idxInsFlags = OPFLAG_USESEEKRESULT;
        sqlite3VdbeAddOp1(v, OP_SeekEnd, iDest);
      }
    }
    if( !HasRowid(pSrc) && pDestIdx->idxType==2 ){
      idxInsFlags |= OPFLAG_NCHANGE;
    }
    sqlite3VdbeAddOp2(v, OP_IdxInsert, iDest, regData);
    sqlite3VdbeChangeP5(v, idxInsFlags|OPFLAG_APPEND);
    sqlite3VdbeAddOp2(v, OP_Next, iSrc, addr1+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp2(v, OP_Close, iSrc, 0);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
  }
  if( emptySrcTest ) sqlite3VdbeJumpHere(v, emptySrcTest);
  sqlite3ReleaseTempReg(pParse, regRowid);
  sqlite3ReleaseTempReg(pParse, regData);
  if( emptyDestTest ){
    sqlite3AutoincrementEnd(pParse);
    sqlite3VdbeAddOp2(v, OP_Halt, SQLITE_OK, 0);
    sqlite3VdbeJumpHere(v, emptyDestTest);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
    return 0;
  }else{
    return 1;
  }
}